

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void AnalyzeFunctionArgumentsEarly
               (ExpressionContext *ctx,SynCallArgument *argumentHead,
               SmallArray<ArgumentData,_16U> *resultArguments)

{
  SynBase *syntax;
  ArgumentData local_58;
  
  while (argumentHead != (SynCallArgument *)0x0) {
    syntax = argumentHead->value;
    if ((syntax == (SynBase *)0x0) || (syntax->typeID != 0x39)) {
      local_58.value = AnalyzeExpression(ctx,syntax);
      local_58.name = argumentHead->name;
      local_58.type = (local_58.value)->type;
      local_58.source = &argumentHead->super_SynBase;
    }
    else {
      local_58.source = (SynBase *)0x0;
      local_58.value = (ExprBase *)0x0;
      local_58.name = (SynIdentifier *)0x0;
      local_58.type = (TypeBase *)0x0;
    }
    local_58.valueFunction = (FunctionData *)0x0;
    local_58.isExplicit = false;
    SmallArray<ArgumentData,_16U>::push_back(resultArguments,&local_58);
    argumentHead = (SynCallArgument *)(argumentHead->super_SynBase).next;
    if ((argumentHead == (SynCallArgument *)0x0) || ((argumentHead->super_SynBase).typeID != 0x18))
    {
      argumentHead = (SynCallArgument *)0x0;
    }
  }
  return;
}

Assistant:

void AnalyzeFunctionArgumentsEarly(ExpressionContext &ctx, SynCallArgument *argumentHead, SmallArray<ArgumentData, 16> &resultArguments)
{
	for(SynCallArgument *el = argumentHead; el; el = getType<SynCallArgument>(el->next))
	{
		if(isType<SynShortFunctionDefinition>(el->value))
		{
			resultArguments.push_back(ArgumentData());
		}
		else
		{
			ExprBase *argument = AnalyzeExpression(ctx, el->value);

			resultArguments.push_back(ArgumentData(el, false, el->name, argument->type, argument));
		}
	}
}